

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O0

u32 crc32_x86_pclmulqdq(u32 crc,u8 *p,size_t len)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  ulong *puVar63;
  ulong in_RDX;
  ulong *in_RSI;
  uint in_EDI;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i barrett_reduction_constants;
  __m128i mults_128b;
  __m128i mults_1v;
  __m128i mults_2v;
  __m128i mults_4v;
  __m128i mults_8v;
  size_t i;
  __m128i x1_2;
  __m128i x0_2;
  __m128i rshift_1;
  __m128i lshift_1;
  __m128i x1_1;
  __m128i x0_1;
  __m128i rshift;
  __m128i lshift;
  ulong local_11c0;
  ulong local_11b8;
  ulong local_11a8;
  ulong uStack_11a0;
  ulong local_1198;
  ulong uStack_1190;
  ulong local_1188;
  ulong uStack_1180;
  ulong local_1178;
  ulong uStack_1170;
  ulong local_1168;
  ulong uStack_1160;
  ulong local_1158;
  ulong uStack_1150;
  ulong local_1148;
  ulong uStack_1140;
  ulong local_1138;
  ulong uStack_1130;
  ulong local_1128;
  ulong uStack_1120;
  ulong local_10b0;
  ulong *local_10a8;
  ulong local_fd8;
  ulong local_fb8;
  uint local_f9c;
  ulong local_f68;
  ulong local_da8;
  ulong uStack_da0;
  ulong local_d88;
  ulong uStack_d80;
  ulong local_d38;
  ulong uStack_d30;
  ulong local_d18;
  ulong uStack_d10;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_ca8;
  ulong uStack_ca0;
  ulong local_c58;
  ulong uStack_c50;
  ulong local_c38;
  ulong uStack_c30;
  ulong local_be8;
  ulong uStack_be0;
  ulong local_bc8;
  ulong uStack_bc0;
  ulong local_b78;
  ulong uStack_b70;
  ulong local_b58;
  ulong uStack_b50;
  ulong local_b08;
  ulong uStack_b00;
  ulong local_ae8;
  ulong uStack_ae0;
  ulong local_a98;
  ulong uStack_a90;
  ulong local_a78;
  ulong uStack_a70;
  ulong local_a28;
  ulong uStack_a20;
  ulong local_a08;
  ulong uStack_a00;
  ulong local_9b8;
  ulong uStack_9b0;
  ulong local_998;
  ulong uStack_990;
  ulong local_948;
  ulong uStack_940;
  ulong local_928;
  ulong uStack_920;
  ulong local_8d8;
  ulong uStack_8d0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_868;
  ulong uStack_860;
  ulong local_848;
  ulong uStack_840;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_788;
  ulong uStack_780;
  ulong local_768;
  ulong uStack_760;
  ulong local_718;
  ulong uStack_710;
  ulong local_6f8;
  ulong uStack_6f0;
  ulong local_6a8;
  ulong uStack_6a0;
  ulong local_688;
  ulong uStack_680;
  ulong local_638;
  ulong uStack_630;
  ulong local_618;
  ulong uStack_610;
  ulong local_5c8;
  ulong uStack_5c0;
  ulong local_5a8;
  ulong uStack_5a0;
  ulong local_558;
  ulong uStack_550;
  ulong local_538;
  ulong uStack_530;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_478;
  ulong uStack_470;
  ulong local_458;
  ulong uStack_450;
  ulong local_408;
  ulong uStack_400;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong local_398;
  ulong uStack_390;
  ulong local_378;
  ulong uStack_370;
  ulong local_328;
  ulong uStack_320;
  ulong local_308;
  ulong uStack_300;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_198;
  ulong uStack_190;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  size_t align;
  __m128i x1;
  __m128i x0;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  
  local_fd8 = (ulong)in_EDI;
  local_10b0 = in_RDX;
  if (in_RDX < 0x80) {
    if (in_RDX < 0x10) {
      if (in_RDX < 0x10) {
        local_f9c = in_EDI;
        for (local_fb8 = 0; local_fb8 < in_RDX; local_fb8 = local_fb8 + 1) {
          local_f9c = local_f9c >> 8 ^
                      crc32_slice1_table
                      [(int)(local_f9c & 0xff ^ (uint)*(byte *)((long)in_RSI + local_fb8))];
        }
        return local_f9c;
      }
      uStack_11a0 = in_RSI[1];
      local_11a8 = *in_RSI ^ local_fd8;
      if (0x1f < in_RDX) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_11a8;
        auVar64 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar2 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar64 = auVar64 ^ ZEXT816(0xae689191) << uVar1;
          }
        }
        local_308 = auVar64._0_8_;
        uStack_300 = auVar64._8_8_;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uStack_11a0;
        auVar64 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar32 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar64 = auVar64 ^ ZEXT816(0xccaa009e) << uVar1;
          }
        }
        local_328 = auVar64._0_8_;
        uStack_320 = auVar64._8_8_;
        local_11a8 = in_RSI[2] ^ local_308 ^ local_328;
        uStack_11a0 = in_RSI[3] ^ uStack_300 ^ uStack_320;
        if (0x2f < in_RDX) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_11a8;
          auVar64 = (undefined1  [16])0x0;
          for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
            if ((auVar3 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
              auVar64 = auVar64 ^ ZEXT816(0xae689191) << uVar1;
            }
          }
          local_378 = auVar64._0_8_;
          uStack_370 = auVar64._8_8_;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uStack_11a0;
          auVar64 = (undefined1  [16])0x0;
          for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
            if ((auVar33 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
              auVar64 = auVar64 ^ ZEXT816(0xccaa009e) << uVar1;
            }
          }
          local_398 = auVar64._0_8_;
          uStack_390 = auVar64._8_8_;
          local_11a8 = in_RSI[4] ^ local_378 ^ local_398;
          uStack_11a0 = in_RSI[5] ^ uStack_370 ^ uStack_390;
        }
      }
      local_10a8 = (ulong *)((in_RDX & 0xfffffffffffffff0) + (long)in_RSI);
      goto LAB_001347ae;
    }
    uStack_1120 = in_RSI[1];
    local_1128 = *in_RSI ^ local_fd8;
    if (0x1f < in_RDX) {
      local_1138 = in_RSI[2];
      uStack_1130 = in_RSI[3];
      if (0x3f < in_RDX) {
        local_1148 = in_RSI[4];
        uStack_1140 = in_RSI[5];
        local_1158 = in_RSI[6];
        uStack_1150 = in_RSI[7];
        local_10a8 = in_RSI + 8;
        goto LAB_001341f5;
      }
      local_10a8 = in_RSI + 4;
      goto LAB_001345b0;
    }
    local_10a8 = in_RSI + 2;
  }
  else {
    if ((in_RDX < 0x10001) || (((ulong)in_RSI & 0xf) == 0)) {
      uStack_1120 = in_RSI[1];
      local_1128 = *in_RSI ^ local_fd8;
      local_10a8 = in_RSI;
    }
    else {
      local_11c0 = -(long)in_RSI & 0xf;
      local_10b0 = in_RDX - local_11c0;
      uStack_11a0 = in_RSI[1];
      local_11a8 = *in_RSI ^ local_fd8;
      local_10a8 = in_RSI + 2;
      if (local_11c0 != 0) {
        auVar62._8_8_ = uStack_11a0;
        auVar62._0_8_ = local_11a8;
        auVar66 = pshufb(auVar62,*(undefined1 (*) [16])(shift_tab + local_11c0));
        auVar64._8_8_ = uStack_11a0;
        auVar64._0_8_ = local_11a8;
        auVar64 = pshufb(auVar64,*(undefined1 (*) [16])(shift_tab + local_11c0 + 0x10));
        auVar64 = pblendvb(auVar64,*(undefined1 (*) [16])((long)local_10a8 + (local_11c0 - 0x10)),
                           *(undefined1 (*) [16])(shift_tab + local_11c0 + 0x10));
        local_168 = auVar66._0_8_;
        uStack_160 = auVar66._8_8_;
        local_178 = auVar64._0_8_;
        uStack_170 = auVar64._8_8_;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = local_168;
        auVar64 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar66 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar64 = auVar64 ^ ZEXT816(0xae689191) << uVar1;
          }
        }
        v5[1] = auVar64._0_8_;
        v4[0] = auVar64._8_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uStack_160;
        auVar64 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar34 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar64 = auVar64 ^ ZEXT816(0xccaa009e) << uVar1;
          }
        }
        v7[1] = auVar64._0_8_;
        v6[0] = auVar64._8_8_;
        local_11a8 = local_178 ^ v5[1] ^ v7[1];
        uStack_11a0 = uStack_170 ^ v4[0] ^ v6[0];
        local_10a8 = (ulong *)(local_11c0 + (long)local_10a8);
        local_11c0 = 0;
      }
      for (; local_11c0 != 0; local_11c0 = local_11c0 - 0x10) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_11a8;
        auVar64 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar4 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar64 = auVar64 ^ ZEXT816(0xae689191) << uVar1;
          }
        }
        local_3e8 = auVar64._0_8_;
        uStack_3e0 = auVar64._8_8_;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uStack_11a0;
        auVar64 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar35 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar64 = auVar64 ^ ZEXT816(0xccaa009e) << uVar1;
          }
        }
        local_408 = auVar64._0_8_;
        uStack_400 = auVar64._8_8_;
        local_11a8 = *local_10a8 ^ local_3e8 ^ local_408;
        uStack_11a0 = local_10a8[1] ^ uStack_3e0 ^ uStack_400;
        local_10a8 = local_10a8 + 2;
      }
      local_1128 = local_11a8;
      uStack_1120 = uStack_11a0;
      local_10a8 = local_10a8 + -2;
    }
    local_1138 = local_10a8[2];
    uStack_1130 = local_10a8[3];
    local_1148 = local_10a8[4];
    uStack_1140 = local_10a8[5];
    local_1158 = local_10a8[6];
    uStack_1150 = local_10a8[7];
    local_1168 = local_10a8[8];
    uStack_1160 = local_10a8[9];
    local_1178 = local_10a8[10];
    uStack_1170 = local_10a8[0xb];
    local_1188 = local_10a8[0xc];
    uStack_1180 = local_10a8[0xd];
    local_1198 = local_10a8[0xe];
    uStack_1190 = local_10a8[0xf];
    puVar63 = local_10a8;
    for (; local_10a8 = puVar63 + 0x10, 0xff < local_10b0; local_10b0 = local_10b0 - 0x80) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_1128;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar5 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_458 = auVar64._0_8_;
      uStack_450 = auVar64._8_8_;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uStack_1120;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar36 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_478 = auVar64._0_8_;
      uStack_470 = auVar64._8_8_;
      local_1128 = *local_10a8 ^ local_458 ^ local_478;
      uStack_1120 = puVar63[0x11] ^ uStack_450 ^ uStack_470;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1138;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar6 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_4c8 = auVar64._0_8_;
      uStack_4c0 = auVar64._8_8_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uStack_1130;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar37 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_4e8 = auVar64._0_8_;
      uStack_4e0 = auVar64._8_8_;
      local_1138 = puVar63[0x12] ^ local_4c8 ^ local_4e8;
      uStack_1130 = puVar63[0x13] ^ uStack_4c0 ^ uStack_4e0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1148;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar7 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_538 = auVar64._0_8_;
      uStack_530 = auVar64._8_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uStack_1140;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar38 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_558 = auVar64._0_8_;
      uStack_550 = auVar64._8_8_;
      local_1148 = puVar63[0x14] ^ local_538 ^ local_558;
      uStack_1140 = puVar63[0x15] ^ uStack_530 ^ uStack_550;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1158;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar8 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_5a8 = auVar64._0_8_;
      uStack_5a0 = auVar64._8_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uStack_1150;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar39 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_5c8 = auVar64._0_8_;
      uStack_5c0 = auVar64._8_8_;
      local_1158 = puVar63[0x16] ^ local_5a8 ^ local_5c8;
      uStack_1150 = puVar63[0x17] ^ uStack_5a0 ^ uStack_5c0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1168;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar9 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_618 = auVar64._0_8_;
      uStack_610 = auVar64._8_8_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uStack_1160;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar40 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_638 = auVar64._0_8_;
      uStack_630 = auVar64._8_8_;
      local_1168 = puVar63[0x18] ^ local_618 ^ local_638;
      uStack_1160 = puVar63[0x19] ^ uStack_610 ^ uStack_630;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1178;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar10 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_688 = auVar64._0_8_;
      uStack_680 = auVar64._8_8_;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uStack_1170;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar41 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_6a8 = auVar64._0_8_;
      uStack_6a0 = auVar64._8_8_;
      local_1178 = puVar63[0x1a] ^ local_688 ^ local_6a8;
      uStack_1170 = puVar63[0x1b] ^ uStack_680 ^ uStack_6a0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1188;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar11 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_6f8 = auVar64._0_8_;
      uStack_6f0 = auVar64._8_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uStack_1180;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar42 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_718 = auVar64._0_8_;
      uStack_710 = auVar64._8_8_;
      local_1188 = puVar63[0x1c] ^ local_6f8 ^ local_718;
      uStack_1180 = puVar63[0x1d] ^ uStack_6f0 ^ uStack_710;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1198;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar12 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x33fff533) << uVar1;
        }
      }
      local_768 = auVar64._0_8_;
      uStack_760 = auVar64._8_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uStack_1190;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar43 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x910eeec1) << uVar1;
        }
      }
      local_788 = auVar64._0_8_;
      uStack_780 = auVar64._8_8_;
      local_1198 = puVar63[0x1e] ^ local_768 ^ local_788;
      uStack_1190 = puVar63[0x1f] ^ uStack_760 ^ uStack_780;
      puVar63 = local_10a8;
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_1128;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar13 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
      }
    }
    local_7d8 = auVar64._0_8_;
    uStack_7d0 = auVar64._8_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_1120;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar44 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
      }
    }
    local_7f8 = auVar64._0_8_;
    uStack_7f0 = auVar64._8_8_;
    local_1128 = local_1168 ^ local_7d8 ^ local_7f8;
    uStack_1120 = uStack_1160 ^ uStack_7d0 ^ uStack_7f0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_1138;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar14 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
      }
    }
    local_848 = auVar64._0_8_;
    uStack_840 = auVar64._8_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uStack_1130;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar45 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
      }
    }
    local_868 = auVar64._0_8_;
    uStack_860 = auVar64._8_8_;
    local_1138 = local_1178 ^ local_848 ^ local_868;
    uStack_1130 = uStack_1170 ^ uStack_840 ^ uStack_860;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_1148;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar15 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
      }
    }
    local_8b8 = auVar64._0_8_;
    uStack_8b0 = auVar64._8_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uStack_1140;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar46 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
      }
    }
    local_8d8 = auVar64._0_8_;
    uStack_8d0 = auVar64._8_8_;
    local_1148 = local_1188 ^ local_8b8 ^ local_8d8;
    uStack_1140 = uStack_1180 ^ uStack_8b0 ^ uStack_8d0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_1158;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar16 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
      }
    }
    local_928 = auVar64._0_8_;
    uStack_920 = auVar64._8_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_1150;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar47 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
      }
    }
    local_948 = auVar64._0_8_;
    uStack_940 = auVar64._8_8_;
    local_1158 = local_1198 ^ local_928 ^ local_948;
    uStack_1150 = uStack_1190 ^ uStack_920 ^ uStack_940;
    if ((local_10b0 & 0x40) != 0) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1128;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar17 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
        }
      }
      local_998 = auVar64._0_8_;
      uStack_990 = auVar64._8_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uStack_1120;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar48 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
        }
      }
      local_9b8 = auVar64._0_8_;
      uStack_9b0 = auVar64._8_8_;
      local_1128 = *local_10a8 ^ local_998 ^ local_9b8;
      uStack_1120 = puVar63[0x11] ^ uStack_990 ^ uStack_9b0;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_1138;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar18 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
        }
      }
      local_a08 = auVar64._0_8_;
      uStack_a00 = auVar64._8_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uStack_1130;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar49 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
        }
      }
      local_a28 = auVar64._0_8_;
      uStack_a20 = auVar64._8_8_;
      local_1138 = puVar63[0x12] ^ local_a08 ^ local_a28;
      uStack_1130 = puVar63[0x13] ^ uStack_a00 ^ uStack_a20;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_1148;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar19 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
        }
      }
      local_a78 = auVar64._0_8_;
      uStack_a70 = auVar64._8_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uStack_1140;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar50 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
        }
      }
      local_a98 = auVar64._0_8_;
      uStack_a90 = auVar64._8_8_;
      local_1148 = puVar63[0x14] ^ local_a78 ^ local_a98;
      uStack_1140 = puVar63[0x15] ^ uStack_a70 ^ uStack_a90;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_1158;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar20 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x8f352d95) << uVar1;
        }
      }
      local_ae8 = auVar64._0_8_;
      uStack_ae0 = auVar64._8_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uStack_1150;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar51 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x1d9513d7) << uVar1;
        }
      }
      local_b08 = auVar64._0_8_;
      uStack_b00 = auVar64._8_8_;
      local_1158 = puVar63[0x16] ^ local_ae8 ^ local_b08;
      uStack_1150 = puVar63[0x17] ^ uStack_ae0 ^ uStack_b00;
      local_10a8 = puVar63 + 0x18;
    }
LAB_001341f5:
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_1128;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar21 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0xf1da05aa) << uVar1;
      }
    }
    local_b58 = auVar64._0_8_;
    uStack_b50 = auVar64._8_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uStack_1120;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar52 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x81256527) << uVar1;
      }
    }
    local_b78 = auVar64._0_8_;
    uStack_b70 = auVar64._8_8_;
    local_1128 = local_1148 ^ local_b58 ^ local_b78;
    uStack_1120 = uStack_1140 ^ uStack_b50 ^ uStack_b70;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_1138;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar22 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0xf1da05aa) << uVar1;
      }
    }
    local_bc8 = auVar64._0_8_;
    uStack_bc0 = auVar64._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uStack_1130;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar53 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0x81256527) << uVar1;
      }
    }
    local_be8 = auVar64._0_8_;
    uStack_be0 = auVar64._8_8_;
    local_1138 = local_1158 ^ local_bc8 ^ local_be8;
    uStack_1130 = uStack_1150 ^ uStack_bc0 ^ uStack_be0;
    if ((local_10b0 & 0x20) != 0) {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_1128;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar23 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0xf1da05aa) << uVar1;
        }
      }
      local_c38 = auVar64._0_8_;
      uStack_c30 = auVar64._8_8_;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uStack_1120;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar54 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x81256527) << uVar1;
        }
      }
      local_c58 = auVar64._0_8_;
      uStack_c50 = auVar64._8_8_;
      local_1128 = *local_10a8 ^ local_c38 ^ local_c58;
      uStack_1120 = local_10a8[1] ^ uStack_c30 ^ uStack_c50;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_1138;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar24 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0xf1da05aa) << uVar1;
        }
      }
      local_ca8 = auVar64._0_8_;
      uStack_ca0 = auVar64._8_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uStack_1130;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar55 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0x81256527) << uVar1;
        }
      }
      local_cc8 = auVar64._0_8_;
      uStack_cc0 = auVar64._8_8_;
      local_1138 = local_10a8[2] ^ local_ca8 ^ local_cc8;
      uStack_1130 = local_10a8[3] ^ uStack_ca0 ^ uStack_cc0;
      local_10a8 = local_10a8 + 4;
    }
LAB_001345b0:
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_1128;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar25 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0xae689191) << uVar1;
      }
    }
    local_d18 = auVar64._0_8_;
    uStack_d10 = auVar64._8_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uStack_1120;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar56 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0xccaa009e) << uVar1;
      }
    }
    local_d38 = auVar64._0_8_;
    uStack_d30 = auVar64._8_8_;
    local_1128 = local_1138 ^ local_d18 ^ local_d38;
    uStack_1120 = uStack_1130 ^ uStack_d10 ^ uStack_d30;
    if ((local_10b0 & 0x10) != 0) {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_1128;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar26 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0xae689191) << uVar1;
        }
      }
      local_d88 = auVar64._0_8_;
      uStack_d80 = auVar64._8_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uStack_1120;
      auVar64 = (undefined1  [16])0x0;
      for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
        if ((auVar57 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
          auVar64 = auVar64 ^ ZEXT816(0xccaa009e) << uVar1;
        }
      }
      local_da8 = auVar64._0_8_;
      uStack_da0 = auVar64._8_8_;
      local_1128 = *local_10a8 ^ local_d88 ^ local_da8;
      uStack_1120 = local_10a8[1] ^ uStack_d80 ^ uStack_da0;
      local_10a8 = local_10a8 + 2;
    }
  }
  local_11a8 = local_1128;
  uStack_11a0 = uStack_1120;
LAB_001347ae:
  local_10b0 = local_10b0 & 0xf;
  if (local_10b0 != 0) {
    auVar61._8_8_ = uStack_11a0;
    auVar61._0_8_ = local_11a8;
    auVar64 = pshufb(auVar61,*(undefined1 (*) [16])(shift_tab + local_10b0));
    auVar60._8_8_ = uStack_11a0;
    auVar60._0_8_ = local_11a8;
    auVar66 = pshufb(auVar60,*(undefined1 (*) [16])(shift_tab + local_10b0 + 0x10));
    auVar66 = pblendvb(auVar66,*(undefined1 (*) [16])((long)local_10a8 + (local_10b0 - 0x10)),
                       *(undefined1 (*) [16])(shift_tab + local_10b0 + 0x10));
    local_2d8 = auVar64._0_8_;
    uStack_2d0 = auVar64._8_8_;
    local_2e8 = auVar66._0_8_;
    uStack_2e0 = auVar66._8_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_2d8;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar27 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0xae689191) << uVar1;
      }
    }
    local_198 = auVar64._0_8_;
    uStack_190 = auVar64._8_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uStack_2d0;
    auVar64 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar58 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar64 = auVar64 ^ ZEXT816(0xccaa009e) << uVar1;
      }
    }
    local_1b8 = auVar64._0_8_;
    uStack_1b0 = auVar64._8_8_;
    local_11a8 = local_2e8 ^ local_198 ^ local_1b8;
    uStack_11a0 = uStack_2e0 ^ uStack_190 ^ uStack_1b0;
  }
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_11a8;
  auVar64 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar29 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar64 = auVar64 ^ ZEXT416(0xccaa009e) << uVar1;
    }
  }
  local_f68 = auVar64._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_f68 ^ uStack_11a0;
  auVar66 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar28 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar66 = auVar66 ^ ZEXT816(0xb4e5b025f7011641) << uVar1;
    }
  }
  local_11b8 = auVar66._0_8_;
  auVar59._4_8_ = 0x1db710641;
  auVar59._0_4_ = 0xb4e5b025;
  auVar65._0_8_ = auVar59._0_8_ << 0x20;
  auVar65._8_4_ = 0xdb710641;
  auVar65._12_4_ = 1;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_11b8;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar65._8_8_;
  auVar66 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar30 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar66 = auVar66 ^ auVar31 << uVar1;
    }
  }
  uStack_11a0._0_4_ = auVar64._8_4_ ^ auVar66._8_4_;
  return (uint)uStack_11a0;
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}